

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potions.cpp
# Opt level: O1

void hit_by_potion(int type,MonsterThing *mp)

{
  byte *pbVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *fmt;
  
  switch(type) {
  case 0:
  case 1:
    iVar3 = save_throw(0,mp);
    if (iVar3 == 0) {
      pbVar1 = (byte *)((long)&mp->flags + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    break;
  case 2:
    iVar3 = save_throw(0,mp);
    if (iVar3 == 0) {
      iVar3 = roll(1,6);
      piVar2 = &(mp->stats).s_hpt;
      *piVar2 = *piVar2 - iVar3;
      iVar3 = roll(1,3);
      (mp->stats).s_str = (mp->stats).s_str - iVar3;
      pcVar5 = set_mname(mp);
      fmt = "%s melts from the liquid";
LAB_00120bd5:
      msg(fmt,pcVar5);
      return;
    }
    break;
  case 3:
    iVar3 = save_throw(0,mp);
    if (iVar3 == 0) {
      (mp->stats).s_str = (mp->stats).s_str + 1;
      pcVar5 = set_mname(mp);
      fmt = "%s looks stronger now...";
      goto LAB_00120bd5;
    }
    break;
  case 5:
    iVar3 = save_throw(0,mp);
    if (iVar3 == 0) {
      iVar4 = roll((mp->stats).s_lvl,4);
      iVar4 = iVar4 + (mp->stats).s_hpt;
      (mp->stats).s_hpt = iVar4;
      iVar3 = (mp->stats).s_maxhp;
      if (iVar3 < iVar4) {
        iVar3 = iVar3 + 1;
        (mp->stats).s_maxhp = iVar3;
        (mp->stats).s_hpt = iVar3;
      }
      pcVar5 = set_mname(mp);
      fmt = "%s looks refreshed";
      goto LAB_00120bd5;
    }
    break;
  case 9:
    iVar3 = save_throw(0,mp);
    if (iVar3 == 0) {
      iVar4 = roll((mp->stats).s_lvl,8);
      iVar4 = iVar4 + (mp->stats).s_hpt;
      (mp->stats).s_hpt = iVar4;
      iVar3 = (mp->stats).s_maxhp;
      if (iVar3 < iVar4) {
        iVar3 = iVar3 + 1;
        (mp->stats).s_maxhp = iVar3;
        (mp->stats).s_hpt = iVar3;
      }
      pcVar5 = set_mname(mp);
      fmt = "%s looks very refreshed";
      goto LAB_00120bd5;
    }
  }
  return;
}

Assistant:

void hit_by_potion(int type, MonsterThing* mp)
{
    switch(type)
    {
    case P_CONFUSE:
        if (!save_throw(VS_POISON, mp))
        {
            mp->flags |= ISHUH;
        }
    when P_LSD:
        if (!save_throw(VS_POISON, mp))
        {
            mp->flags |= ISHUH;
        }
    when P_POISON:
        if (!save_throw(VS_POISON, mp))
        {
            //Hit by a potion of poison. Do 1d6 damage. Plus 1d3 strength damage.
            mp->stats.s_hpt -= roll(1, 6);
            mp->stats.s_str -= roll(1, 3);
            msg("%s melts from the liquid", set_mname(mp));
        }
    when P_STRENGTH:
        if (!save_throw(VS_POISON, mp))
        {
            //Hit by a potion of strength, add a strength and tell the thrower that this was a bad move.
            mp->stats.s_str += 1;
            msg("%s looks stronger now...", set_mname(mp));
        }
    when P_SEEINVIS:
    when P_HEALING:
        if (!save_throw(VS_POISON, mp))
        {
            if ((mp->stats.s_hpt += roll(mp->stats.s_lvl, 4)) > mp->stats.s_maxhp)
                mp->stats.s_hpt = ++mp->stats.s_maxhp;
            msg("%s looks refreshed", set_mname(mp));
        }
    when P_MFIND:
    when P_TFIND:
    when P_RAISE:
    when P_XHEAL:
        if (!save_throw(VS_POISON, mp))
        {
            if ((mp->stats.s_hpt += roll(mp->stats.s_lvl, 8)) > mp->stats.s_maxhp)
                mp->stats.s_hpt = ++mp->stats.s_maxhp;
            msg("%s looks very refreshed", set_mname(mp));
        }
    when P_HASTE:
    when P_RESTORE:
    when P_BLIND:
    when P_LEVIT:
        break;
    }
}